

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O2

void __thiscall
ScriptCompression::Unser<HashVerifier<AutoFile>>
          (ScriptCompression *this,HashVerifier<AutoFile> *s,CScript *script)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  Span<unsigned_char> local_68;
  CompressedScript vch;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  if (uVar2 < 6) {
    uVar3 = GetSpecialScriptSize(uVar2);
    local_68.m_data = (uchar *)((ulong)local_68.m_data & 0xffffffffffffff00);
    prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector(&vch,uVar3,(uchar *)&local_68);
    uVar3 = vch._size - 0x22;
    local_68.m_data = (uchar *)vch._union.indirect_contents.indirect;
    if (vch._size < 0x22) {
      uVar3 = vch._size;
      local_68.m_data = (uchar *)&vch;
    }
    local_68.m_size = (size_t)uVar3;
    HashVerifier<AutoFile>::operator>>(s,&local_68);
    DecompressScript(script,uVar2,&vch);
    prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&vch);
  }
  else {
    uVar2 = uVar2 - 6;
    if (10000 < uVar2) {
      CScript::operator<<(script,OP_RETURN);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        HashVerifier<AutoFile>::ignore(s,(ulong)uVar2);
        return;
      }
      goto LAB_0076a080;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,uVar2);
    uVar2 = (script->super_CScriptBase)._size;
    vch._union.indirect_contents.indirect = (char *)script;
    if (0x1c < uVar2) {
      vch._union.indirect_contents.indirect =
           (char *)(CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    uVar3 = uVar2 - 0x1d;
    if (0x1c >= uVar2) {
      uVar3 = uVar2;
    }
    vch._union._8_8_ = ZEXT48(uVar3);
    HashVerifier<AutoFile>::operator>>(s,(Span<unsigned_char> *)&vch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0076a080:
  __stack_chk_fail();
}

Assistant:

void Unser(Stream &s, CScript& script) {
        unsigned int nSize = 0;
        s >> VARINT(nSize);
        if (nSize < nSpecialScripts) {
            CompressedScript vch(GetSpecialScriptSize(nSize), 0x00);
            s >> Span{vch};
            DecompressScript(script, nSize, vch);
            return;
        }
        nSize -= nSpecialScripts;
        if (nSize > MAX_SCRIPT_SIZE) {
            // Overly long script, replace with a short invalid one
            script << OP_RETURN;
            s.ignore(nSize);
        } else {
            script.resize(nSize);
            s >> Span{script};
        }
    }